

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O2

void Qentem::Test::TestLoopUTag1(QTest *test)

{
  StringStream<char16_t> *pSVar1;
  Value<char16_t> *pVVar2;
  Value<char16_t> value1;
  Value<char16_t> local_88;
  Value<char16_t> value2;
  StringStream<char16_t> ss;
  Value<char16_t> value3;
  
  value1.type_ = Undefined;
  ss.storage_ = (char16_t *)0x0;
  ss.length_ = 0;
  ss.capacity_ = 0;
  value1.field_0.array_.storage_ = (Value<char16_t> *)0x0;
  value1.field_0._8_8_ = 0;
  value3.type_ = Undefined;
  value3.field_0.array_.storage_ = (Value<char16_t> *)0x0;
  value3.field_0._8_8_ = 0;
  Value<char16_t>::operator+=(&value1,100);
  Value<char16_t>::operator+=(&value1,-0x32);
  Value<char16_t>::operator+=(&value1,L"Qentem");
  Value<char16_t>::operator+=(&value1,true);
  Value<char16_t>::operator+=(&value1,false);
  Value<char16_t>::operator+=(&value1,(NullType)0x0);
  Value<char16_t>::operator+=(&value1,3);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[41]>
            (test,pSVar1,(char16_t (*) [41])L"100, -50, Qentem, true, false, null, 3, ",0xb19);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value    =    \"loop1-value\">{var:loop1-value}, {var:loop1-value} </loop>"
                      ,&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[74]>
            (test,pSVar1,
             (char16_t (*) [74])
             L"100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 ",0xb1e);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char16_t>::Reset(&value1);
  Value<char16_t>::operator+=(&value1,0);
  Value<char16_t>::operator+=(&value1,1);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
                      ,&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[29]>
            (test,pSVar1,(char16_t (*) [29])L"(0: 0) (0: 1) (1: 0) (1: 1) ",0xb29);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
                      ,&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[81]>
            (test,pSVar1,
             (char16_t (*) [81])
             L"(0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) ",
             0xb2f);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
                      ,&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[209]>
            (test,pSVar1,
             (char16_t (*) [209])
             L"(0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) "
             ,0xb37);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  JSON::Parse<char16_t>(&value2,L"[100, -50, \"A\", true, false, null]");
  Value<char16_t>::operator=(&value1,&value2);
  Value<char16_t>::~Value(&value2);
  JSON::Parse<char16_t>
            (&value2,
             L"{\"k-1\": 4, \"k-2\":1.5, \"k-3\":\"ABC\", \"k-4\":true, \"k-5\":false, \"k-6\":null}"
            );
  pVVar2 = Value<char16_t>::operator[](&value3,L"arr1");
  Value<char16_t>::operator=(pVVar2,&value1);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb44);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",&value2,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb48);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",&value3
                      ,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb4c);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar2 = Value<char16_t>::operator[](&value3,L"arr1");
  Value<char16_t>::operator=(pVVar2,&value2);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",&value3
                      ,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb52);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar2 = Value<char16_t>::operator[](&value3,L"arr1");
  Value<char16_t>::operator=(pVVar2,&value1);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\" >{var:loop1-value}, </loop>",&value1,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb59);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",&value2,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb5d);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\"set=\"arr1\">{var:loop1-value}, </loop>",&value3,
                      &ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb61);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pVVar2 = Value<char16_t>::operator[](&value3,L"arr1");
  Value<char16_t>::operator=(pVVar2,&value2);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\'arr1\' value=\"loop1-value\">{var:loop1-value}, </loop>",&value3
                      ,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb67);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char16_t>::Reset(&value3);
  pVVar2 = Value<char16_t>::operator[](&value3,L"arr1");
  pVVar2 = Value<char16_t>::operator[](pVVar2,L"arr2");
  pVVar2 = Value<char16_t>::operator[](pVVar2,L"arr3");
  Value<char16_t>::operator=(pVVar2,&value1);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"arr1[arr2][arr3]\" value=\"loop1-value\">{var:loop1-value}, </loop>"
                      ,&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb6f);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char16_t>::Reset(&value3);
  pVVar2 = Value<char16_t>::operator[](&value3,0);
  pVVar2 = Value<char16_t>::operator[](pVVar2,0);
  Value<char16_t>::operator+=(pVVar2,&value2);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"0[0][0]\"value=\"loop1-value\">{var:loop1-value}, </loop>",
                      &value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb76);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char16_t>::Reset(&value3);
  pVVar2 = Value<char16_t>::operator[](&value3,L"k1");
  pVVar2 = Value<char16_t>::operator[](pVVar2,0);
  pVVar2 = Value<char16_t>::operator[](pVVar2,L"k3");
  Value<char16_t>::operator=(pVVar2,&value1);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\" set=\"k1[0][k3]\">{var:loop1-value}, </loop>",
                      &value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb7d);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char16_t>::Reset(&value3);
  pVVar2 = Value<char16_t>::operator[](&value3,0);
  pVVar2 = Value<char16_t>::operator[](pVVar2,L"k2");
  Value<char16_t>::operator+=(pVVar2,&value2);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"0[k2][0]\"value=\"loop1-value\">{var:loop1-value}, {var:loop1-value}, </loop>"
                      ,&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[65]>
            (test,pSVar1,
             (char16_t (*) [65])L"4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, ",
             0xb85);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  JSON::Parse<char16_t>(&local_88,L"{\"group\":[[10],[20],[30]]}");
  Value<char16_t>::operator=(&value3,&local_88);
  Value<char16_t>::~Value(&local_88);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"group\" value=\"Val_1\"><loop set=\"Val_1\" value=\"Val_2\">{var:Val_2}</loop></loop>"
                      ,&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar1,(char16_t (*) [7])L"102030",0xb8b);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  JSON::Parse<char16_t>(&local_88,L"{\"group\":[1,2,3,4]}");
  Value<char16_t>::operator=(&value3,&local_88);
  Value<char16_t>::~Value(&local_88);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"group\" value=\"Val_\">{var:Val_}</loop>",&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar1,(char16_t (*) [5])L"1234",0xb91);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  JSON::Parse<char16_t>(&local_88,L"{\"numbers\":[1,2,3,4,5,6,7,8]}");
  Value<char16_t>::operator=(&value3,&local_88);
  Value<char16_t>::~Value(&local_88);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"A<loop set=\"numbers\" value=\"l_id1\">{var:l_id1}</loop>B",&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar1,(char16_t (*) [11])L"A12345678B",0xb96);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"numbers\" value=\"l_id1\">{var:l_id1[0]}</loop>",&value3,&ss);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[113]>
            (test,pSVar1,
             (char16_t (*) [113])
             L"{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}"
             ,0xb9d);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value(&value2);
  Value<char16_t>::~Value(&value3);
  Value<char16_t>::~Value(&value1);
  Memory::Deallocate(ss.storage_);
  return;
}

Assistant:

static void TestLoopUTag1(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value1;
    Value<char16_t>        value3;
    const char16_t        *content;

    value1 += 100;
    value1 += -50;
    value1 += uR"(Qentem)";
    value1 += true;
    value1 += false;
    value1 += nullptr;
    value1 += 3;

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, Qentem, true, false, null, 3, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value    =    "loop1-value">{var:loop1-value}, {var:loop1-value} </loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 uR"(100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 )", __LINE__);
    ss.Clear();

    ////////////////

    value1.Reset();
    value1 += 0;
    value1 += 1;

    content =
        uR"(<loop value="loop1-value"><loop value="loop2-value">({var:loop1-value}: {var:loop2-value}) </loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"((0: 0) (0: 1) (1: 0) (1: 1) )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value"><loop value="loop2-value"><loop
                 value="loop3-value">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 uR"((0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) )", __LINE__);
    ss.Clear();

    content = uR"(<loop value='loop1-value'><loop value='loop2-value'><loop
                 value='loop3-value'><loop value='loop4-value'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>)";
    test.IsEqual(
        Template::Render(content, value1, ss),
        uR"((0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) )",
        __LINE__);
    ss.Clear();

    //////////////////////

    value1 = JSON::Parse(uR"([100, -50, "A", true, false, null])");
    const Value<char16_t> value2 =
        JSON::Parse(uR"({"k-1": 4, "k-2":1.5, "k-3":"ABC", "k-4":true, "k-5":false, "k-6":null})");

    //////////////////////
    value3[uR"(arr1)"] = value1;

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[uR"(arr1)"] = value2;

    content = uR"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3[uR"(arr1)"] = value1;

    content = uR"(<loop value="loop1-value" >{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value"set="arr1">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[uR"(arr1)"] = value2;

    content = uR"(<loop set='arr1' value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3.Reset();
    value3[uR"(arr1)"][uR"(arr2)"][uR"(arr3)"] = value1;

    content = uR"(<loop set="arr1[arr2][arr3]" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][0] += value2;

    content = uR"(<loop set="0[0][0]"value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[uR"(k1)"][0][uR"(k3)"] = value1;

    content = uR"(<loop value="loop1-value" set="k1[0][k3]">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][uR"(k2)"] += value2;

    content = uR"(<loop set="0[k2][0]"value="loop1-value">{var:loop1-value}, {var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss),
                 uR"(4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, )", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(uR"({"group":[[10],[20],[30]]})");

    content = uR"(<loop set="group" value="Val_1"><loop set="Val_1" value="Val_2">{var:Val_2}</loop></loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(102030)", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(uR"({"group":[1,2,3,4]})");

    content = uR"(<loop set="group" value="Val_">{var:Val_}</loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(1234)", __LINE__);
    ss.Clear();

    value3  = JSON::Parse(uR"({"numbers":[1,2,3,4,5,6,7,8]})");
    content = uR"(A<loop set="numbers" value="l_id1">{var:l_id1}</loop>B)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(A12345678B)", __LINE__);
    ss.Clear();

    content = uR"(<loop set="numbers" value="l_id1">{var:l_id1[0]}</loop>)";
    test.IsEqual(
        Template::Render(content, value3, ss),
        uR"({var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]})",
        __LINE__);
    ss.Clear();
}